

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::fromLocal8Bit(QString *__return_storage_ptr__,QString *this,QByteArrayView ba)

{
  long in_FS_OFFSET;
  QByteArrayView in;
  QStringDecoder local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((storage_type *)ba.m_size == (storage_type *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_001219eb;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (this == (QString *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"";
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      local_50.super_QStringConverter.iface = QStringConverter::encodingInterfaces + 2;
      local_50.super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
      super_QFlagsStorage<QStringConverter::Flag>.i =
           (QFlagsStorageHelper<QStringConverter::Flag,_4>)
           (QFlagsStorage<QStringConverter::Flag>)0x1;
      local_50.super_QStringConverter.state._4_8_ = 0;
      local_50.super_QStringConverter.state._12_8_ = 0;
      local_50.super_QStringConverter.state._20_8_ = 0;
      local_50.super_QStringConverter.state.field_4.state_data[1] = 0;
      local_50.super_QStringConverter.state.field_4.state_data[2] = 0;
      local_50.super_QStringConverter.state.field_4.state_data[3] = 0;
      local_50.super_QStringConverter.state.clearFn = (ClearDataFn)0x0;
      in.m_data = (storage_type *)ba.m_size;
      in.m_size = (qsizetype)this;
      QStringDecoder::decodeAsString(__return_storage_ptr__,&local_50,in);
      QStringConverter::State::clear(&local_50.super_QStringConverter.state);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_001219eb:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::fromLocal8Bit(QByteArrayView ba)
{
    if (ba.isNull())
        return QString();
    if (ba.isEmpty())
        return QString(DataPointer::fromRawData(&_empty, 0));
    QStringDecoder toUtf16(QStringDecoder::System, QStringDecoder::Flag::Stateless);
    return toUtf16(ba);
}